

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall Lowerer::LowerInlineBuiltIn(Lowerer *this,Instr *builtInEndInstr)

{
  undefined2 uVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  StackSym *pSVar5;
  SymOpnd *pSVar6;
  Instr *pIVar7;
  Instr *pIVar8;
  Instr *this_00;
  
  uVar1 = builtInEndInstr->m_opcode;
  if (1 < (ushort)(uVar1 - 0x24d)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2ef9,
                       "(builtInEndInstr->m_opcode == Js::OpCode::InlineBuiltInEnd || builtInEndInstr->m_opcode == Js::OpCode::InlineNonTrackingBuiltInEnd)"
                       ,
                       "builtInEndInstr->m_opcode == Js::OpCode::InlineBuiltInEnd || builtInEndInstr->m_opcode == Js::OpCode::InlineNonTrackingBuiltInEnd"
                      );
    if (!bVar3) goto LAB_005608b1;
    *puVar4 = 0;
  }
  pSVar5 = IR::Opnd::GetStackSym(builtInEndInstr->m_src2);
  pIVar8 = (pSVar5->field_5).m_instrDef;
  if ((pIVar8 != (Instr *)0x0 & pSVar5->field_0x18) == 1) {
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                       ,0x1af,"(linkSym->IsSingleDef())","linkSym->IsSingleDef()");
    if (!bVar3) {
LAB_005608b1:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
    pIVar8 = (pSVar5->field_5).m_instrDef;
  }
  this_00 = (Instr *)0x0;
  do {
    if (pIVar8->m_src2 == (Opnd *)0x0) {
LAB_00560823:
      pIVar7 = (Instr *)0x0;
    }
    else {
      bVar3 = IR::Opnd::IsSymOpnd(pIVar8->m_src2);
      if (!bVar3) goto LAB_00560823;
      pSVar6 = IR::Opnd::AsSymOpnd(pIVar8->m_src2);
      pSVar5 = Sym::AsStackSym(pSVar6->m_sym);
      bVar3 = StackSym::IsArgSlotSym(pSVar5);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                           ,0x1b8,"(linkSym->IsArgSlotSym())","linkSym->IsArgSlotSym()");
        if (!bVar3) goto LAB_005608b1;
        *puVar4 = 0;
      }
      if (((pSVar5->field_0x18 & 1) == 0) || ((pSVar5->field_5).m_instrDef == (Instr *)0x0)) {
        bVar3 = Func::IsInPhase(builtInEndInstr->m_func,FGPeepsPhase);
        if (!bVar3) {
          bVar3 = Func::IsInPhase(builtInEndInstr->m_func,FGBuildPhase);
          if (!bVar3) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar4 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                               ,0x1bf,
                               "(linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase)))"
                               ,
                               "linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase))"
                              );
            if (!bVar3) goto LAB_005608b1;
            *puVar4 = 0;
          }
        }
      }
      if ((pSVar5->field_0x18 & 1) == 0) goto LAB_00560823;
      pIVar7 = (pSVar5->field_5).m_instrDef;
    }
    if (pIVar8->m_opcode != ArgOut_A_InlineSpecialized) {
      if (pIVar8->m_opcode == StartCall) {
        if (pIVar7 != (Instr *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar4 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                             ,0x1ce,"(nextArg == nullptr)","nextArg == nullptr");
          if (!bVar3) goto LAB_005608b1;
          *puVar4 = 0;
        }
        break;
      }
      pSVar5 = IR::Opnd::GetStackSym(pIVar8->m_src2);
      this_00 = (pSVar5->field_5).m_instrDef;
    }
    pIVar8 = pIVar7;
  } while (pIVar7 != (Instr *)0x0);
  IR::Instr::Unlink(this_00);
  IR::Instr::Remove(builtInEndInstr);
  return;
}

Assistant:

void Lowerer::LowerInlineBuiltIn(IR::Instr* builtInEndInstr)
{
    Assert(builtInEndInstr->m_opcode == Js::OpCode::InlineBuiltInEnd || builtInEndInstr->m_opcode == Js::OpCode::InlineNonTrackingBuiltInEnd);
    IR::Instr* startCallInstr = nullptr;
    builtInEndInstr->IterateArgInstrs([&](IR::Instr* argInstr) {
        startCallInstr = argInstr->GetSrc2()->GetStackSym()->m_instrDef;
        return false;
    });
    // Keep the startCall around as bailout refers to it. Just unlink it for now - do not delete it.
    startCallInstr->Unlink();
    builtInEndInstr->Remove();
}